

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
libcellml::Parser::ParserImpl::loadUnitsFromComponent
          (ParserImpl *this,ModelPtr *model,XmlNodePtr *node)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  shared_ptr<libcellml::XmlNode> local_60;
  undefined1 local_50 [8];
  UnitsPtr units;
  undefined1 local_30 [8];
  XmlNodePtr childNode;
  XmlNodePtr *node_local;
  ModelPtr *model_local;
  ParserImpl *this_local;
  
  childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstChild((XmlNode *)local_30);
  while (bVar1 = std::operator!=((shared_ptr<libcellml::XmlNode> *)local_30,(nullptr_t)0x0), bVar1)
  {
    this_00 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_30);
    bVar1 = XmlNode::isCellml1XElement(this_00,"units");
    if (bVar1) {
      Units::create();
      loadUnits(this,(UnitsPtr *)local_50,(XmlNodePtr *)local_30);
      this_01 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)model);
      Model::addUnits(this_01,(UnitsPtr *)local_50);
      std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_50);
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_30);
    XmlNode::next((XmlNode *)&local_60);
    std::shared_ptr<libcellml::XmlNode>::operator=
              ((shared_ptr<libcellml::XmlNode> *)local_30,&local_60);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_60);
  }
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr((shared_ptr<libcellml::XmlNode> *)local_30);
  return;
}

Assistant:

void Parser::ParserImpl::loadUnitsFromComponent(const ModelPtr &model, const XmlNodePtr &node)
{
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (childNode->isCellml1XElement("units")) {
            UnitsPtr units = Units::create();
            loadUnits(units, childNode);
            model->addUnits(units);
        }
        childNode = childNode->next();
    }
}